

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn.c
# Opt level: O2

void bignum_to_string(bn *n,char *str,int nbytes)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  
  if (n == (bn *)0x0) {
    __assert_fail("n && \"n is null\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x7f,"void bignum_to_string(struct bn *, char *, int)");
  }
  if (str == (char *)0x0) {
    __assert_fail("str && \"str is null\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x80,"void bignum_to_string(struct bn *, char *, int)");
  }
  if (nbytes < 1) {
    __assert_fail("nbytes > 0 && \"nbytes must be positive\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x81,"void bignum_to_string(struct bn *, char *, int)");
  }
  if ((nbytes & 1U) == 0) {
    uVar3 = 0x1f;
    pcVar4 = str;
    for (uVar5 = 1; (-1 < (int)uVar3 && (uVar5 < (uint)nbytes)); uVar5 = uVar5 + 8) {
      sprintf(pcVar4,"%.08x",(ulong)n->array[uVar3]);
      uVar3 = uVar3 - 1;
      pcVar4 = pcVar4 + 8;
    }
    uVar3 = 0xffffffff;
    pcVar4 = str;
    do {
      uVar3 = uVar3 + 1;
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 == '0');
    for (lVar2 = 0; lVar2 < (int)(nbytes - uVar3); lVar2 = lVar2 + 1) {
      str[lVar2] = str[lVar2 + (ulong)uVar3];
    }
    str[lVar2] = '\0';
    return;
  }
  __assert_fail("(nbytes & 1) == 0 && \"string format must be in hex -> equal number of bytes\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                ,0x82,"void bignum_to_string(struct bn *, char *, int)");
}

Assistant:

void bignum_to_string(struct bn* n, char* str, int nbytes)
{
  require(n, "n is null");
  require(str, "str is null");
  require(nbytes > 0, "nbytes must be positive");
  require((nbytes & 1) == 0, "string format must be in hex -> equal number of bytes");

  int j = BN_ARRAY_SIZE - 1; /* index into array - reading "MSB" first -> big-endian */
  int i = 0;                 /* index into string representation. */

  /* reading last array-element "MSB" first -> big endian */
  while ((j >= 0) && (nbytes > (i + 1)))
  {
    sprintf(&str[i], SPRINTF_FORMAT_STR, n->array[j]);
    i += (2 * WORD_SIZE); /* step WORD_SIZE hex-byte(s) forward in the string. */
    j -= 1;               /* step one element back in the array. */
  }

  /* Count leading zeros: */
  j = 0;
  while (str[j] == '0')
  {
    j += 1;
  }
 
  /* Move string j places ahead, effectively skipping leading zeros */ 
  for (i = 0; i < (nbytes - j); ++i)
  {
    str[i] = str[i + j];
  }

  /* Zero-terminate string */
  str[i] = 0;
}